

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O1

string * duckdb_apache::thrift::to_string<duckdb_parquet::RowGroup>
                   (string *__return_storage_ptr__,vector<duckdb_parquet::RowGroup,_true> *t)

{
  ostream *poVar1;
  __normal_iterator<const_duckdb_parquet::RowGroup_*,_std::vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>_>
  *in_RCX;
  ostringstream o;
  string local_1c0;
  __normal_iterator<const_duckdb_parquet::RowGroup_*,_std::vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>_>
  local_1a0;
  pointer local_198;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[",1);
  local_198 = (t->super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>)
              .
              super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1a0._M_current =
       (t->super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>).
       super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  to_string<__gnu_cxx::__normal_iterator<duckdb_parquet::RowGroup_const*,std::vector<duckdb_parquet::RowGroup,std::allocator<duckdb_parquet::RowGroup>>>>
            (&local_1c0,(thrift *)&local_198,&local_1a0,in_RCX);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const duckdb::vector<T>& t) {
  std::ostringstream o;
  o << "[" << to_string(t.begin(), t.end()) << "]";
  return o.str();
}